

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall ON_Xform::IsZeroTransformation(ON_Xform *this,double tol)

{
  bool bVar1;
  int i;
  ulong uVar2;
  double (*padVar3) [4];
  int j;
  ulong uVar4;
  
  bVar1 = true;
  padVar3 = (double (*) [4])this;
  for (uVar2 = 0; (bVar1 != false && (uVar2 < 4)); uVar2 = uVar2 + 1) {
    for (uVar4 = 0; (bVar1 != false && (uVar4 < 4)); uVar4 = uVar4 + 1) {
      if (uVar4 != 3 || uVar2 != 3) {
        bVar1 = ABS((*(double (*) [4])*padVar3)[uVar4]) <= tol;
      }
    }
    padVar3 = padVar3 + 1;
  }
  return (bool)(bVar1 & this->m_xform[3][3] == 1.0);
}

Assistant:

bool ON_Xform::IsZeroTransformation(double tol) const
{
	bool rc = true;
	for(int i=0; rc && i<4; i++)
		for (int j = 0; rc && j < 4; j++)
		{
			if (i == 3 && j == 3)
				continue;
			rc = fabs(m_xform[i][j]) <= tol;
		}
  return (rc && 1.0 == m_xform[3][3] );
}